

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *mtctx,size_t srcSize,ZSTD_EndDirective endOp)

{
  size_t *psVar1;
  ZSTD_CCtx_params *__dest;
  uint uVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  int iVar5;
  undefined8 in_RAX;
  size_t sVar6;
  ZSTD_CDict *pZVar7;
  undefined2 *puVar8;
  uint uVar9;
  ulong uVar10;
  ZSTDMT_jobDescription *pZVar11;
  uint uVar12;
  bool bVar13;
  buffer_t bVar14;
  
  uVar2 = mtctx->jobIDMask;
  uVar9 = uVar2 & mtctx->nextJobID;
  sVar6 = CONCAT71((int7)((ulong)in_RAX >> 8),endOp == ZSTD_e_end);
  if (mtctx->doneJobID + uVar2 < mtctx->nextJobID) {
    if (uVar9 != (mtctx->doneJobID & uVar2)) {
      __assert_fail("(mtctx->nextJobID & mtctx->jobIDMask) == (mtctx->doneJobID & mtctx->jobIDMask)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5099,
                    "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)");
    }
  }
  else {
    if (mtctx->jobReady == 0) {
      pZVar11 = mtctx->jobs;
      pvVar3 = (mtctx->inBuff).buffer.start;
      pZVar11[uVar9].src.start = pvVar3;
      pZVar11[uVar9].src.size = srcSize;
      if ((mtctx->inBuff).filled < srcSize) {
        __assert_fail("mtctx->inBuff.filled >= srcSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x50a3,
                      "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                     );
      }
      sVar6 = (mtctx->inBuff).prefix.size;
      pZVar11[uVar9].prefix.start = (mtctx->inBuff).prefix.start;
      pZVar11[uVar9].prefix.size = sVar6;
      __dest = &mtctx->jobs[uVar9].params;
      *(undefined1 (*) [16])((long)(__dest + -2) + 0x58) = ZEXT816(0) << 0x20;
      memcpy(__dest,&mtctx->params,0x90);
      if (mtctx->nextJobID == 0) {
        pZVar7 = mtctx->cdict;
      }
      else {
        pZVar7 = (ZSTD_CDict *)0x0;
      }
      pZVar11 = mtctx->jobs;
      pZVar11[uVar9].cdict = pZVar7;
      pZVar11[uVar9].fullFrameSize = mtctx->frameContentSize;
      pZVar11[uVar9].dstBuff.start = (void *)0x0;
      pZVar11[uVar9].dstBuff.capacity = 0;
      auVar4._0_8_ = mtctx->bufPool;
      auVar4._8_8_ = mtctx->cctxPool;
      auVar4 = vpermilps_avx(auVar4,0x4e);
      pZVar11 = mtctx->jobs;
      pZVar11[uVar9].cctxPool = (ZSTDMT_CCtxPool *)auVar4._0_8_;
      pZVar11[uVar9].bufPool = (ZSTDMT_bufferPool *)auVar4._8_8_;
      pZVar11[uVar9].seqPool = mtctx->seqPool;
      pZVar11[uVar9].serial = &mtctx->serial;
      uVar2 = mtctx->nextJobID;
      pZVar11[uVar9].jobID = uVar2;
      pZVar11[uVar9].firstJob = (uint)(uVar2 == 0);
      uVar12 = (uint)(endOp == ZSTD_e_end);
      pZVar11[uVar9].lastJob = uVar12;
      pZVar11[uVar9].frameChecksumNeeded =
           (uint)(((mtctx->params).fParams.checksumFlag != 0 && uVar2 != 0) && endOp == ZSTD_e_end);
      pZVar11[uVar9].dstFlushed = 0;
      psVar1 = &(mtctx->roundBuff).pos;
      *psVar1 = *psVar1 + srcSize;
      (mtctx->inBuff).filled = 0;
      (mtctx->inBuff).buffer.start = (void *)0x0;
      (mtctx->inBuff).buffer.capacity = 0;
      if (endOp == ZSTD_e_end) {
        (mtctx->inBuff).prefix = (range_t)(ZEXT816(0) << 0x20);
        mtctx->frameEnded = uVar12;
        if (uVar2 == 0) {
          (mtctx->params).fParams.checksumFlag = 0;
        }
        else if (srcSize == 0) {
          if (pZVar11[uVar9].lastJob != 1) {
            __assert_fail("job->lastJob == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x5082,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
          }
          pZVar11 = pZVar11 + uVar9;
          if ((pZVar11->src).size != 0) {
            __assert_fail("job->src.size == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x5083,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
          }
          if (pZVar11->firstJob != 0) {
            __assert_fail("job->firstJob == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x5084,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
          }
          if ((pZVar11->dstBuff).start == (void *)0x0) {
            bVar14 = ZSTDMT_getBuffer(pZVar11->bufPool);
            puVar8 = (undefined2 *)bVar14.start;
            pZVar11->dstBuff = bVar14;
            if (puVar8 == (undefined2 *)0x0) {
              pZVar11->cSize = 0xffffffffffffffc0;
            }
            else {
              if (bVar14.capacity < 3) {
                __assert_fail("job->dstBuff.capacity >= ZSTD_blockHeaderSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x508b,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
              }
              (pZVar11->src).start = (void *)0x0;
              (pZVar11->src).size = 0;
              *puVar8 = 1;
              *(undefined1 *)(puVar8 + 1) = 0;
              pZVar11->cSize = 3;
              if (pZVar11->consumed != 0) {
                __assert_fail("job->consumed == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x508f,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
              }
            }
            mtctx->nextJobID = mtctx->nextJobID + 1;
            return (size_t)puVar8;
          }
          __assert_fail("job->dstBuff.start == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5085,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
        }
      }
      else {
        uVar10 = mtctx->targetPrefixSize;
        if (srcSize <= mtctx->targetPrefixSize) {
          uVar10 = srcSize;
        }
        (mtctx->inBuff).prefix.start = (void *)((long)pvVar3 + (srcSize - uVar10));
        (mtctx->inBuff).prefix.size = uVar10;
        if (srcSize == 0 && uVar2 != 0) {
          __assert_fail("endOp == ZSTD_e_end",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x50c9,
                        "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                       );
        }
      }
    }
    else {
      pZVar11 = mtctx->jobs;
    }
    iVar5 = POOL_tryAdd(mtctx->factory,ZSTDMT_compressionJob,pZVar11 + uVar9);
    bVar13 = iVar5 == 0;
    if (!bVar13) {
      mtctx->nextJobID = mtctx->nextJobID + 1;
    }
    sVar6 = (size_t)bVar13;
    mtctx->jobReady = (uint)bVar13;
  }
  return sVar6;
}

Assistant:

static size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx* mtctx, size_t srcSize, ZSTD_EndDirective endOp)
{
    unsigned const jobID = mtctx->nextJobID & mtctx->jobIDMask;
    int const endFrame = (endOp == ZSTD_e_end);

    if (mtctx->nextJobID > mtctx->doneJobID + mtctx->jobIDMask) {
        DEBUGLOG(5, "ZSTDMT_createCompressionJob: will not create new job : table is full");
        assert((mtctx->nextJobID & mtctx->jobIDMask) == (mtctx->doneJobID & mtctx->jobIDMask));
        return 0;
    }

    if (!mtctx->jobReady) {
        BYTE const* src = (BYTE const*)mtctx->inBuff.buffer.start;
        DEBUGLOG(5, "ZSTDMT_createCompressionJob: preparing job %u to compress %u bytes with %u preload ",
                    mtctx->nextJobID, (U32)srcSize, (U32)mtctx->inBuff.prefix.size);
        mtctx->jobs[jobID].src.start = src;
        mtctx->jobs[jobID].src.size = srcSize;
        assert(mtctx->inBuff.filled >= srcSize);
        mtctx->jobs[jobID].prefix = mtctx->inBuff.prefix;
        mtctx->jobs[jobID].consumed = 0;
        mtctx->jobs[jobID].cSize = 0;
        mtctx->jobs[jobID].params = mtctx->params;
        mtctx->jobs[jobID].cdict = mtctx->nextJobID==0 ? mtctx->cdict : NULL;
        mtctx->jobs[jobID].fullFrameSize = mtctx->frameContentSize;
        mtctx->jobs[jobID].dstBuff = g_nullBuffer;
        mtctx->jobs[jobID].cctxPool = mtctx->cctxPool;
        mtctx->jobs[jobID].bufPool = mtctx->bufPool;
        mtctx->jobs[jobID].seqPool = mtctx->seqPool;
        mtctx->jobs[jobID].serial = &mtctx->serial;
        mtctx->jobs[jobID].jobID = mtctx->nextJobID;
        mtctx->jobs[jobID].firstJob = (mtctx->nextJobID==0);
        mtctx->jobs[jobID].lastJob = endFrame;
        mtctx->jobs[jobID].frameChecksumNeeded = mtctx->params.fParams.checksumFlag && endFrame && (mtctx->nextJobID>0);
        mtctx->jobs[jobID].dstFlushed = 0;

        /* Update the round buffer pos and clear the input buffer to be reset */
        mtctx->roundBuff.pos += srcSize;
        mtctx->inBuff.buffer = g_nullBuffer;
        mtctx->inBuff.filled = 0;
        /* Set the prefix */
        if (!endFrame) {
            size_t const newPrefixSize = MIN(srcSize, mtctx->targetPrefixSize);
            mtctx->inBuff.prefix.start = src + srcSize - newPrefixSize;
            mtctx->inBuff.prefix.size = newPrefixSize;
        } else {   /* endFrame==1 => no need for another input buffer */
            mtctx->inBuff.prefix = kNullRange;
            mtctx->frameEnded = endFrame;
            if (mtctx->nextJobID == 0) {
                /* single job exception : checksum is already calculated directly within worker thread */
                mtctx->params.fParams.checksumFlag = 0;
        }   }

        if ( (srcSize == 0)
          && (mtctx->nextJobID>0)/*single job must also write frame header*/ ) {
            DEBUGLOG(5, "ZSTDMT_createCompressionJob: creating a last empty block to end frame");
            assert(endOp == ZSTD_e_end);  /* only possible case : need to end the frame with an empty last block */
            ZSTDMT_writeLastEmptyBlock(mtctx->jobs + jobID);
            mtctx->nextJobID++;
            return 0;
        }
    }

    DEBUGLOG(5, "ZSTDMT_createCompressionJob: posting job %u : %u bytes  (end:%u, jobNb == %u (mod:%u))",
                mtctx->nextJobID,
                (U32)mtctx->jobs[jobID].src.size,
                mtctx->jobs[jobID].lastJob,
                mtctx->nextJobID,
                jobID);
    if (POOL_tryAdd(mtctx->factory, ZSTDMT_compressionJob, &mtctx->jobs[jobID])) {
        mtctx->nextJobID++;
        mtctx->jobReady = 0;
    } else {
        DEBUGLOG(5, "ZSTDMT_createCompressionJob: no worker available for job %u", mtctx->nextJobID);
        mtctx->jobReady = 1;
    }
    return 0;
}